

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O2

size_t __thiscall clickhouse::BufferOutput::DoNext(BufferOutput *this,void **data,size_t len)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  size_t sVar1;
  pointer puVar2;
  ulong __new_size;
  
  this_00 = this->buf_;
  sVar1 = this->pos_;
  __new_size = sVar1 + len;
  puVar2 = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) < __new_size) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,__new_size);
    sVar1 = this->pos_;
    puVar2 = (this->buf_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
             .super__Vector_impl_data._M_start;
    __new_size = sVar1 + len;
  }
  *data = puVar2 + sVar1;
  this->pos_ = __new_size;
  return len;
}

Assistant:

size_t BufferOutput::DoNext(void** data, size_t len) {
    if (pos_ + len > buf_->size()) {
        buf_->resize(pos_ + len);
    }

    *data = buf_->data() + pos_;
    pos_ += len;

    return len;
}